

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_avx2.c
# Opt level: O2

uint sad64xh_avx2(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int iVar3;
  undefined1 (*pauVar4) [32];
  undefined1 (*pauVar5) [32];
  bool bVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [32];
  
  iVar3 = 0;
  if (0 < h) {
    iVar3 = h;
  }
  pauVar4 = (undefined1 (*) [32])(ref_ptr + 0x20);
  pauVar5 = (undefined1 (*) [32])(src_ptr + 0x20);
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  while( true ) {
    bVar6 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    auVar7 = auVar8._0_32_;
    if (bVar6) break;
    auVar9 = vpsadbw_avx2(pauVar4[-1],pauVar5[-1]);
    auVar2 = vpsadbw_avx2(*pauVar4,*pauVar5);
    auVar7 = vpaddd_avx2(auVar9,auVar7);
    auVar7 = vpaddd_avx2(auVar7,auVar2);
    auVar8 = ZEXT3264(auVar7);
    pauVar4 = (undefined1 (*) [32])(*pauVar4 + ref_stride);
    pauVar5 = (undefined1 (*) [32])(*pauVar5 + src_stride);
  }
  auVar9 = vpsrldq_avx2(auVar7,8);
  auVar7 = vpaddd_avx2(auVar9,auVar7);
  auVar1 = vpaddd_avx(auVar7._0_16_,auVar7._16_16_);
  return auVar1._0_4_;
}

Assistant:

static inline unsigned int sad64xh_avx2(const uint8_t *src_ptr, int src_stride,
                                        const uint8_t *ref_ptr, int ref_stride,
                                        int h) {
  int i;
  __m256i sad1_reg, sad2_reg, ref1_reg, ref2_reg;
  __m256i sum_sad = _mm256_setzero_si256();
  __m256i sum_sad_h;
  __m128i sum_sad128;
  for (i = 0; i < h; i++) {
    ref1_reg = _mm256_loadu_si256((__m256i const *)ref_ptr);
    ref2_reg = _mm256_loadu_si256((__m256i const *)(ref_ptr + 32));
    sad1_reg =
        _mm256_sad_epu8(ref1_reg, _mm256_loadu_si256((__m256i const *)src_ptr));
    sad2_reg = _mm256_sad_epu8(
        ref2_reg, _mm256_loadu_si256((__m256i const *)(src_ptr + 32)));
    sum_sad = _mm256_add_epi32(sum_sad, _mm256_add_epi32(sad1_reg, sad2_reg));
    ref_ptr += ref_stride;
    src_ptr += src_stride;
  }
  sum_sad_h = _mm256_srli_si256(sum_sad, 8);
  sum_sad = _mm256_add_epi32(sum_sad, sum_sad_h);
  sum_sad128 = _mm256_extracti128_si256(sum_sad, 1);
  sum_sad128 = _mm_add_epi32(_mm256_castsi256_si128(sum_sad), sum_sad128);
  unsigned int res = (unsigned int)_mm_cvtsi128_si32(sum_sad128);
  _mm256_zeroupper();
  return res;
}